

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  GCtrace *T;
  TValue *f;
  void *cf_1;
  void *cf;
  BCPos pos;
  GCproto *pt;
  BCIns *ins;
  cTValue *nextframe_local;
  GCfunc *fn_local;
  lua_State *L_local;
  BCPos local_8;
  
  if ((fn->c).ffid == '\0') {
    if (nextframe == (cTValue *)0x0) {
      uVar2 = (ulong)L->cframe & 0xfffffffffffffffc;
      if ((uVar2 == 0) || (*(int *)(uVar2 + 0x1c) == *(int *)(uVar2 + 0x18))) {
        return 0xffffffff;
      }
      ins = (BCIns *)(ulong)*(uint *)(uVar2 + 0x1c);
    }
    else if (((nextframe->field_2).it & 3) == 0) {
      ins = (BCIns *)(ulong)(nextframe->field_2).it;
    }
    else if (((nextframe->field_2).it & 7) == 2) {
      ins = (BCIns *)(ulong)*(uint *)((long)nextframe + -4);
    }
    else {
      cf_1 = (void *)((ulong)L->cframe & 0xfffffffffffffffc);
      f = L->base + -1;
      while( true ) {
        if (cf_1 == (void *)0x0) {
          return 0xffffffff;
        }
        while ((*(int *)((long)cf_1 + 0x10) < 0 &&
               (f < (TValue *)((ulong)(L->stack).ptr32 + (long)-*(int *)((long)cf_1 + 0x10))))) {
          cf_1 = (void *)(*(ulong *)((long)cf_1 + 0x30) & 0xfffffffffffffffc);
          if (cf_1 == (void *)0x0) {
            return 0xffffffff;
          }
        }
        if (f < nextframe) break;
        if (((f->field_2).it & 3) == 0) {
          lVar3 = (ulong)((*(uint *)((ulong)(f->field_2).it - 4) >> 8 & 0xff) + 1) * -8;
        }
        else {
          if ((((f->field_2).it & 3) == 1) || ((((f->field_2).it & 7) == 2 && (f[-1].u32.lo == 1))))
          {
            cf_1 = (void *)(*(ulong *)((long)cf_1 + 0x30) & 0xfffffffffffffffc);
          }
          lVar3 = -((long)(int)(f->field_2).it & 0xfffffffffffffff8U);
        }
        f = (TValue *)((long)f + lVar3);
      }
      ins = (BCIns *)(ulong)*(uint *)((long)cf_1 + 0x1c);
      if (ins == (BCIns *)0x0) {
        return 0xffffffff;
      }
    }
    uVar2 = (ulong)(fn->c).pc.ptr32;
    pos = (int)((long)((long)ins - uVar2) >> 2) - 1;
    if (*(uint *)(uVar2 - 0x38) < pos) {
      uVar1 = ins[-1] & 0xff;
      bVar4 = true;
      if (((uVar1 != 0x49) && (bVar4 = true, uVar1 != 0x4a)) && (bVar4 = true, uVar1 != 0x4b)) {
        bVar4 = uVar1 == 0x4c;
      }
      if (bVar4) {
        pos = (BCPos)((long)(ins[-2] - uVar2) >> 2);
      }
      else {
        pos = 0xffffffff;
      }
    }
    local_8 = pos;
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    if (bc_isret(bc_op(ins[-1]))) {
      GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
      pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
    } else {
      pos = NO_BCPOS;  /* Punt in case of stack overflow for stitched trace. */
    }
  }
#endif
  return pos;
}